

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  size_t sVar1;
  long *plVar2;
  int *piVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  contenc_writer *writer;
  Curl_handler *pCVar7;
  void *pvVar8;
  curl_off_t *pcVar9;
  curl_off_t cVar10;
  long lVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  _Bool _Var20;
  byte bVar21;
  uint uVar22;
  CURLcode CVar23;
  CHUNKcode code;
  anon_enum_32 aVar24;
  int iVar25;
  timediff_t tVar26;
  char *pcVar27;
  size_t sVar28;
  size_t sVar29;
  long lVar30;
  curl_socket_t writefd;
  size_t sVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  char *pcVar35;
  curl_socket_t readfd0;
  long lVar36;
  bool bVar37;
  curltime cVar38;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  ssize_t bytes_written;
  _Bool local_59;
  _Bool readmore;
  undefined7 uStack_57;
  _Bool *local_50;
  SingleRequest *local_48;
  long local_40;
  _Bool *local_38;
  
  uVar32 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar22 = (data->req).keepon;
  writefd = -1;
  readfd0 = writefd;
  if ((uVar22 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar22 & 0x2a) == 2) {
    writefd = conn->writesockfd;
  }
  uVar32 = uVar32 | (conn->data->state).drain != 0;
  if (uVar32 == 0) {
    uVar32 = Curl_socket_check(readfd0,-1,writefd,0);
  }
  if (uVar32 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  local_48 = &data->req;
  uVar22 = (data->req).keepon;
  uVar34 = 0;
  local_38 = comeback;
  if (((uVar22 & 1) != 0) && (((uVar32 & 1) != 0 || ((conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    *comeback = false;
    iVar25 = 100;
    uVar22 = 0;
    local_40 = 0;
    local_50 = done;
    do {
      sVar29 = (data->set).buffer_size;
      lVar30 = (data->req).size;
      if (((lVar30 != -1) && ((data->req).header == false)) &&
         (sVar31 = lVar30 - (data->req).bytecount, (long)sVar31 < (long)sVar29)) {
        sVar29 = sVar31;
      }
      if (sVar29 != 0) {
        CVar23 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar29,&bytes_written);
        if (CVar23 == CURLE_OK) goto LAB_00430c32;
        if (CVar23 != CURLE_AGAIN) {
          return CVar23;
        }
LAB_0043122a:
        uVar34 = uVar22;
        if (0 < iVar25) goto LAB_00431242;
        break;
      }
      bytes_written = 0;
LAB_00430c32:
      if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
         (Curl_pgrsTime(data,TIMER_STARTTRANSFER), (data->req).exp100 != EXP100_SEND_DATA)) {
        cVar38 = Curl_now();
        (data->req).start100.tv_sec = cVar38.tv_sec;
        (data->req).start100.tv_usec = cVar38.tv_usec;
      }
      if (bytes_written == 0) {
        bVar37 = (data->req).bodywrites == 0;
      }
      else {
        bVar37 = false;
      }
      if (bytes_written < 1 && !bVar37) {
        piVar3 = &(data->req).keepon;
        *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
LAB_00431226:
        uVar22 = 1;
        goto LAB_0043122a;
      }
      (data->req).buf[bytes_written] = '\0';
      (data->req).str = (data->req).buf;
      p_Var6 = conn->handler->readwrite;
      if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
        CVar23 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar23 != CURLE_OK) {
          return CVar23;
        }
        if (readmore != false) goto LAB_00431226;
      }
      if ((data->req).header == true) {
        local_59 = false;
        CVar23 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_59);
        if (CVar23 != CURLE_OK) {
          return CVar23;
        }
        p_Var6 = conn->handler->readwrite;
        if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
            && ((data->req).maxdownload < 1)) && (0 < bytes_written)) {
          CVar23 = (*p_Var6)(data,conn,&bytes_written,&readmore);
          if (CVar23 != CURLE_OK) {
            return CVar23;
          }
          if (readmore != false) goto LAB_00431226;
        }
        if (local_59 == true) {
          if (0 < bytes_written) {
            _Var20 = Curl_pipeline_wanted(conn->data->multi,1);
            pcVar27 = (data->state).up.path;
            if (_Var20) {
              Curl_infof(data,"Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                         bytes_written,pcVar27);
              conn->read_pos = conn->read_pos - bytes_written;
              (conn->bits).stream_was_rewound = true;
            }
            else {
              Curl_infof(data,
                         "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                         ,bytes_written,pcVar27);
            }
          }
          goto LAB_00431226;
        }
      }
      if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
         (0 < bytes_written || bVar37)) {
        if ((data->set).opt_no_body == true) {
          Curl_conncontrol(conn,2);
          *local_50 = true;
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (((data->req).bodywrites == 0 && !bVar37) && ((conn->handler->protocol & 0x40003) != 0))
        {
          if ((data->req).newurl != (char *)0x0) {
            if ((conn->bits).close == true) {
              piVar3 = &(data->req).keepon;
              *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
              *local_50 = true;
              uVar34 = 1;
              done = local_50;
              goto LAB_00431277;
            }
            (data->req).ignorebody = true;
            Curl_infof(data,"Ignoring the response-body\n");
          }
          lVar30 = (data->state).resume_from;
          if (((lVar30 != 0) && ((data->req).content_range == false)) &&
             (((data->set).httpreq == HTTPREQ_GET && ((data->req).ignorebody == false)))) {
            if (local_48->size != lVar30) {
              Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
              return CURLE_RANGE_ERROR;
            }
            Curl_infof(data,"The entire document is already downloaded");
            uVar34 = 1;
            Curl_conncontrol(conn,1);
            piVar3 = &(data->req).keepon;
            *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
            *local_50 = true;
            done = local_50;
            goto LAB_00431277;
          }
          if ((((data->set).timecondition != CURL_TIMECOND_NONE) &&
              ((data->state).range == (char *)0x0)) &&
             (_Var20 = Curl_meets_timecondition(data,(data->req).timeofdoc), done = local_50,
             !_Var20)) {
            *local_50 = true;
            (data->info).httpcode = 0x130;
            Curl_infof(data,"Simulate a HTTP 304 response!\n");
            uVar34 = 1;
            Curl_conncontrol(conn,1);
            goto LAB_00431277;
          }
        }
        plVar2 = &(data->req).bodywrites;
        *plVar2 = *plVar2 + 1;
        if (((data->set).verbose == true) &&
           (((data->req).badheader == HEADER_NORMAL ||
            (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen),
            (data->req).badheader == HEADER_PARTHEADER)))) {
          Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written);
        }
        if ((data->req).chunk == true) {
          code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
          if (CHUNKE_OK < code) {
            if (code != CHUNKE_WRITE_ERROR) {
              pcVar27 = Curl_chunked_strerror(code);
              Curl_failf(data,"%s in chunked-encoding",pcVar27);
              return CURLE_RECV_ERROR;
            }
            Curl_failf(data,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          if (code == CHUNKE_STOP) {
            piVar3 = &(data->req).keepon;
            *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
            sVar29 = (conn->chunk).dataleft;
            if (sVar29 != 0) {
              Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n",sVar29);
              _Var20 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var20) {
                Curl_infof(conn->data,"Rewinding %zu bytes\n",sVar29);
                conn->read_pos = conn->read_pos - sVar29;
                (conn->bits).stream_was_rewound = true;
              }
            }
          }
        }
        if ((data->req).badheader == HEADER_PARTHEADER) {
          lVar30 = (data->req).bytecount;
          if ((data->req).ignorebody == false) {
            lVar30 = lVar30 + (data->req).hbuflen;
            (data->req).bytecount = lVar30;
          }
        }
        else {
          lVar30 = (data->req).bytecount;
        }
        lVar11 = (data->req).maxdownload;
        if (lVar11 != -1) {
          lVar36 = (bytes_written + lVar30) - lVar11;
          if (lVar11 <= bytes_written + lVar30) {
            if ((lVar36 != 0) && ((data->req).ignorebody == false)) {
              _Var20 = Curl_pipeline_wanted(conn->data->multi,1);
              if (_Var20) {
                Curl_infof(data,
                           "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                           ,lVar36,(data->state).up.path,(data->req).size,(data->req).maxdownload,
                           (data->req).bytecount,bytes_written);
                conn->read_pos = conn->read_pos - lVar36;
                (conn->bits).stream_was_rewound = true;
              }
              else {
                Curl_infof(data,
                           "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                           ,lVar36,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
              }
            }
            lVar30 = (data->req).bytecount;
            bytes_written = (data->req).maxdownload - lVar30;
            if (bytes_written < 1) {
              bytes_written = 0;
            }
            piVar3 = &(data->req).keepon;
            *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
            local_40 = lVar36;
          }
        }
        (data->req).bytecount = lVar30 + bytes_written;
        Curl_pgrsSetDownloadCounter(data,lVar30 + bytes_written);
        if (((data->req).chunk == false) &&
           (aVar24 = (data->req).badheader,
           (aVar24 != HEADER_NORMAL || bytes_written != 0) || bVar37)) {
          if (aVar24 == HEADER_NORMAL) {
LAB_004310e5:
            if ((conn->data->set).http_ce_skip == true) {
              bVar21 = (data->req).ignorebody;
LAB_00431124:
              if ((bVar21 & 1) != 0) goto LAB_00431128;
              CVar23 = Curl_client_write(conn,1,(data->req).str,bytes_written);
            }
            else {
              writer = (data->req).writer_stack;
              bVar21 = (data->req).ignorebody;
              if (writer == (contenc_writer *)0x0) goto LAB_00431124;
              if ((bVar21 & 1) != 0) goto LAB_00431128;
              CVar23 = Curl_unencode_write(conn,writer,(data->req).str,bytes_written);
            }
            (data->req).badheader = HEADER_NORMAL;
            if (CVar23 != CURLE_OK) {
              return CVar23;
            }
          }
          else {
            if ((data->req).ignorebody == false) {
              sVar29 = (data->req).maxdownload;
              sVar31 = (data->req).hbuflen;
              sVar28 = sVar29;
              if ((long)sVar31 < (long)sVar29) {
                sVar28 = sVar31;
              }
              if (sVar29 == 0xffffffffffffffff) {
                sVar28 = sVar31;
              }
              CVar23 = Curl_client_write(conn,1,(data->state).headerbuff,sVar28);
              if (CVar23 != CURLE_OK) {
                return CVar23;
              }
              aVar24 = (data->req).badheader;
            }
            if (aVar24 < HEADER_ALLBAD) goto LAB_004310e5;
LAB_00431128:
            (data->req).badheader = HEADER_NORMAL;
          }
        }
      }
      pCVar7 = conn->handler;
      p_Var6 = pCVar7->readwrite;
      if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) &&
          (local_40 != 0)) && ((conn->bits).stream_was_rewound == false)) {
        pcVar27 = (data->req).str + bytes_written;
        (data->req).str = pcVar27;
        pcVar35 = (data->req).buf + (data->set).buffer_size;
        bytes_written = (long)pcVar35 - (long)pcVar27;
        if (pcVar27 + local_40 <= pcVar35) {
          bytes_written = local_40;
        }
        CVar23 = (*p_Var6)(data,conn,&bytes_written,&readmore);
        if (CVar23 != CURLE_OK) {
          return CVar23;
        }
        if (readmore == true) {
          piVar3 = &(data->req).keepon;
          *(byte *)piVar3 = (byte)*piVar3 | 1;
        }
        goto LAB_00431226;
      }
      if (bVar37) {
        piVar3 = &(data->req).keepon;
        *(byte *)piVar3 = (byte)*piVar3 & 0xfe;
      }
      uVar34 = 1;
      if (((pCVar7->protocol & 0x30) == 0) &&
         (_Var20 = Curl_ssl_data_pending(conn,0), uVar22 = 1, !_Var20)) goto LAB_0043122a;
      uVar22 = 1;
      bVar37 = iVar25 != 0;
      iVar25 = iVar25 + -1;
    } while (bVar37);
    conn->cselect_bits = 1;
    *local_38 = true;
LAB_00431242:
    done = local_50;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar3 = &(data->req).keepon;
      *(byte *)piVar3 = (byte)*piVar3 & 0xfd;
    }
LAB_00431277:
    if (*done != false) {
      return CURLE_OK;
    }
    uVar22 = (data->req).keepon;
  }
  uVar33 = uVar34;
  if ((uVar32 & uVar22 & 2) == 0) goto LAB_004313ff;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar33 = uVar34 | 2;
  sVar29 = (data->req).upload_present;
  if (sVar29 != 0) {
LAB_00430ab6:
    CVar23 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,sVar29,&bytes_written);
    if (CVar23 != CURLE_OK) {
      return CVar23;
    }
    if ((data->set).verbose == true) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written);
    }
    lVar30 = (data->req).writebytecount + bytes_written;
    (data->req).writebytecount = lVar30;
    if ((((data->req).upload_chunky != true) || ((data->req).forbidchunk == true)) &&
       (lVar30 == (data->state).infilesize)) {
      (data->req).upload_done = true;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar30 = (data->req).upload_present - bytes_written;
    if (lVar30 == 0) {
      CVar23 = Curl_get_upload_buffer(data);
      if (CVar23 != CURLE_OK) {
        return CVar23;
      }
      (data->req).upload_fromhere = (data->state).ulbuf;
      (data->req).upload_present = 0;
      if (((data->req).upload_done == true) &&
         (CVar23 = done_sending(conn,local_48), CVar23 != CURLE_OK)) {
        return CVar23;
      }
    }
    else {
      (data->req).upload_present = lVar30;
      ppcVar4 = &(data->req).upload_fromhere;
      *ppcVar4 = *ppcVar4 + bytes_written;
    }
    Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
    goto LAB_004313ff;
  }
  CVar23 = Curl_get_upload_buffer(data);
  if (CVar23 != CURLE_OK) {
    return CVar23;
  }
  (data->req).upload_fromhere = (data->state).ulbuf;
  if ((data->req).upload_done == false) {
    pvVar8 = (data->req).protop;
    if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar8 + 0x218) == 2)) {
      (data->req).exp100 = EXP100_AWAITING_CONTINUE;
      piVar3 = &(data->req).keepon;
      *(byte *)piVar3 = (byte)*piVar3 & 0xfd;
      cVar38 = Curl_now();
      (data->req).start100.tv_sec = cVar38.tv_sec;
      (data->req).start100.tv_usec = cVar38.tv_usec;
      Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
      uVar33 = uVar34;
      goto LAB_004313ff;
    }
    if ((conn->handler->protocol & 0x40003) == 0) {
      bVar37 = false;
    }
    else {
      bVar37 = *(int *)((long)pvVar8 + 0x218) == 1;
    }
    CVar23 = Curl_fillreadbuffer(conn,(data->set).upload_buffer_size,(size_t *)&readmore);
    if (CVar23 != CURLE_OK) {
      return CVar23;
    }
    sVar29 = CONCAT71(uStack_57,readmore);
    if (sVar29 == 0) goto LAB_004311e7;
    if (0 < (long)sVar29) {
      (data->req).upload_present = sVar29;
      if ((!bVar37) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
        if ((data->state).scratch == (char *)0x0) {
          pcVar27 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
          (data->state).scratch = pcVar27;
          if (pcVar27 == (char *)0x0) {
            Curl_failf(data,"Failed to alloc scratch buffer!");
            return CURLE_OUT_OF_MEMORY;
          }
        }
        sVar31 = 0;
        for (sVar28 = 0; sVar29 != sVar28; sVar28 = sVar28 + 1) {
          cVar5 = (data->req).upload_fromhere[sVar28];
          pcVar27 = (data->state).scratch;
          if (cVar5 == '\n') {
            sVar1 = sVar31 + 1;
            pcVar27[sVar31] = '\r';
            (data->state).scratch[sVar31 + 1] = '\n';
            sVar31 = sVar1;
            if (((data->set).crlf == false) && (lVar30 = (data->state).infilesize, lVar30 != -1)) {
              (data->state).infilesize = lVar30 + 1;
            }
          }
          else {
            pcVar27[sVar31] = cVar5;
          }
          sVar31 = sVar31 + 1;
        }
        if (sVar31 == sVar29) {
          sVar29 = (data->req).upload_present;
        }
        else {
          (data->req).upload_fromhere = (data->state).scratch;
          (data->req).upload_present = sVar31;
          sVar29 = sVar31;
        }
      }
      goto LAB_00430ab6;
    }
  }
  else {
LAB_004311e7:
    if (((data->req).keepon & 0x20) != 0) goto LAB_004313ff;
  }
  CVar23 = done_sending(conn,local_48);
  if (CVar23 != CURLE_OK) {
    return CVar23;
  }
LAB_004313ff:
  cVar38 = Curl_now();
  (data->req).now.tv_sec = cVar38.tv_sec;
  (data->req).now.tv_usec = cVar38.tv_usec;
  if (uVar33 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (uVar12 = (data->req).start100.tv_sec, uVar13 = (data->req).start100.tv_usec,
       older.tv_usec = uVar13, older.tv_sec = uVar12, newer._12_4_ = 0,
       newer.tv_sec = SUB128(cVar38._0_12_,0), newer.tv_usec = SUB124(cVar38._0_12_,8),
       older._12_4_ = 0, tVar26 = Curl_timediff(newer,older),
       (data->set).expect_100_timeout <= tVar26)) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar3 = &(data->req).keepon;
      *(byte *)piVar3 = (byte)*piVar3 | 2;
      Curl_expire_done(data,EXPIRE_100_TIMEOUT);
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar9 = (data->req).bytecountp;
    if (pcVar9 != (curl_off_t *)0x0) {
      *pcVar9 = (data->req).bytecount;
    }
    pcVar9 = (data->req).writebytecountp;
    if (pcVar9 != (curl_off_t *)0x0) {
      *pcVar9 = (data->req).writebytecount;
    }
  }
  iVar25 = Curl_pgrsUpdate(conn);
  if (iVar25 == 0) {
    uVar14 = (data->req).now.tv_sec;
    uVar15 = (data->req).now.tv_usec;
    cVar38.tv_usec = uVar15;
    cVar38.tv_sec = uVar14;
    cVar38._12_4_ = 0;
    CVar23 = Curl_speedcheck(data,cVar38);
    if (CVar23 != CURLE_OK) {
      return CVar23;
    }
    if ((data->req).keepon == 0) {
      if ((data->set).opt_no_body == false) {
        lVar30 = local_48->size;
        if ((((lVar30 != -1) && (lVar11 = (data->req).bytecount, lVar30 != lVar11)) &&
            (lVar11 != lVar30 + (data->state).crlf_conversions)) &&
           ((data->req).newurl == (char *)0x0)) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if (((data->req).chunk == true) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar25 = Curl_pgrsUpdate(conn);
      if (iVar25 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar26 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar26 < 0) {
        lVar30 = (data->req).size;
        uVar16 = (data->req).now.tv_sec;
        uVar17 = (data->req).now.tv_usec;
        newer_00.tv_usec = uVar17;
        newer_00.tv_sec = uVar16;
        uVar18 = (data->progress).t_startsingle.tv_sec;
        uVar19 = (data->progress).t_startsingle.tv_usec;
        older_00.tv_usec = uVar19;
        older_00.tv_sec = uVar18;
        newer_00._12_4_ = 0;
        older_00._12_4_ = 0;
        tVar26 = Curl_timediff(newer_00,older_00);
        cVar10 = (data->req).bytecount;
        if (lVar30 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     tVar26,cVar10);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,tVar26,cVar10,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat = 0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_now();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      timediff_t ms = Curl_timediff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}